

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcBooleanClippingResult::~IfcBooleanClippingResult
          (IfcBooleanClippingResult *this)

{
  ~IfcBooleanClippingResult
            ((IfcBooleanClippingResult *)
             ((long)&(this->super_IfcBooleanResult).super_IfcGeometricRepresentationItem.
                     super_IfcRepresentationItem.
                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                     _vptr_ObjectHelper +
             (long)(this->super_IfcBooleanResult).super_IfcGeometricRepresentationItem.
                   super_IfcRepresentationItem.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                   _vptr_ObjectHelper[-3]));
  return;
}

Assistant:

IfcBooleanClippingResult() : Object("IfcBooleanClippingResult") {}